

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  Tables *pTVar1;
  DescriptorPool *pDVar2;
  key_type kVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int32 iVar8;
  SourceCodeInfo *from;
  SourceCodeInfo *pSVar9;
  FileDescriptorTables *pFVar10;
  ulong uVar11;
  string *psVar12;
  string *__rhs;
  FileDescriptor **ppFVar13;
  GoogleOnceDynamic *pGVar14;
  Rep *pRVar15;
  int *piVar16;
  FileDescriptor *pFVar17;
  DescriptorProto *pDVar18;
  EnumDescriptorProto *proto_00;
  ServiceDescriptorProto *proto_01;
  FieldDescriptorProto *proto_02;
  FileOptions *orig_options;
  reference options_to_interpret;
  Descriptor *message;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar19;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar20;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar21;
  bool local_332;
  bool local_331;
  int local_21c;
  iterator iStack_218;
  int i_9;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_210;
  iterator iter;
  OptionInterpreter option_interpreter;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int index_1;
  int i_4;
  int weak_dependency_count;
  int i_3;
  int local_19c;
  int local_198;
  int index;
  int i_2;
  int public_dependency_count;
  undefined1 local_188;
  _Self local_180;
  _Self local_178;
  _Self local_170;
  _Self local_168;
  undefined4 local_15c;
  SourceCodeInfo *local_158;
  FileDescriptor *dependency;
  byte local_148;
  _Base_ptr local_140;
  byte local_138;
  key_type local_12c;
  _Rb_tree_const_iterator<int> _Stack_128;
  int i_1;
  undefined1 local_120;
  int32 local_118;
  int local_114;
  undefined1 local_110 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  SourceCodeInfo *local_30;
  SourceCodeInfo *info;
  FileDescriptor *result;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  result = (FileDescriptor *)proto;
  proto_local = (FileDescriptorProto *)this;
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  info = (SourceCodeInfo *)
         DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
  this->file_ = (FileDescriptor *)info;
  *(undefined1 *)&info[3].super_Message.super_MessageLite._vptr_MessageLite = 0;
  *(undefined1 *)&info[3].location_.super_RepeatedPtrFieldBase.rep_ = 0;
  bVar4 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)result);
  if (bVar4) {
    pSVar9 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                       (this->tables_,(SourceCodeInfo *)0x0);
    local_30 = pSVar9;
    from = FileDescriptorProto::source_code_info((FileDescriptorProto *)result);
    SourceCodeInfo::CopyFrom(pSVar9,from);
    *(SourceCodeInfo **)&info[3].location_.super_RepeatedPtrFieldBase.current_size_ = local_30;
  }
  else {
    pSVar9 = SourceCodeInfo::default_instance();
    *(SourceCodeInfo **)&info[3].location_.super_RepeatedPtrFieldBase.current_size_ = pSVar9;
  }
  pFVar10 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar10;
  *(FileDescriptorTables **)(this->file_ + 0xa8) = this->file_tables_;
  bVar4 = FileDescriptorProto::has_name((FileDescriptorProto *)result);
  if (!bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    AddError(this,&local_50,(Message *)result,OTHER,"Missing field: FileDescriptorProto.name.");
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)result);
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) == 0) {
    psVar12 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)result);
    bVar4 = std::operator==(psVar12,"proto2");
    if (!bVar4) {
      psVar12 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)result);
      bVar4 = std::operator==(psVar12,"proto3");
      if (bVar4) {
        *(undefined4 *)(this->file_ + 0x8c) = 3;
      }
      else {
        *(undefined4 *)(this->file_ + 0x8c) = 0;
        psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
        pFVar17 = result;
        __rhs = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)result);
        std::operator+(&local_88,"Unrecognized syntax: ",__rhs);
        AddError(this,psVar12,(Message *)pFVar17,OTHER,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      goto LAB_004de772;
    }
  }
  *(undefined4 *)(this->file_ + 0x8c) = 2;
LAB_004de772:
  pTVar1 = this->tables_;
  psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
  psVar12 = DescriptorPool::Tables::AllocateString(pTVar1,psVar12);
  (info->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)psVar12;
  bVar4 = FileDescriptorProto::has_package((FileDescriptorProto *)result);
  if (bVar4) {
    pTVar1 = this->tables_;
    psVar12 = FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)result);
    psVar12 = DescriptorPool::Tables::AllocateString(pTVar1,psVar12);
    (info->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = psVar12;
  }
  else {
    pTVar1 = this->tables_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"",
               (allocator<char> *)
               ((long)&seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    psVar12 = DescriptorPool::Tables::AllocateString(pTVar1,&local_a8);
    (info->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = psVar12;
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  *(DescriptorPool **)&info->_has_bits_ = this->pool_;
  bVar4 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)info);
  if (bVar4) {
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)info);
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      psVar12 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)info);
      AddPackage(this,psVar12,(Message *)result,(FileDescriptor *)info);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&weak_deps._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result);
    *(int *)&(info->location_).super_RepeatedPtrFieldBase.arena_ = iVar6;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result);
    ppFVar13 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                         (pTVar1,iVar6);
    *(FileDescriptor ***)&(info->location_).super_RepeatedPtrFieldBase.current_size_ = ppFVar13;
    if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
      info[1].super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
      (info->location_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
    }
    else {
      pGVar14 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      info[1].super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)pGVar14;
      pTVar1 = this->tables_;
      iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result);
      pRVar15 = (Rep *)DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                                 (pTVar1,iVar6);
      (info->location_).super_RepeatedPtrFieldBase.rep_ = pRVar15;
      pRVar15 = (info->location_).super_RepeatedPtrFieldBase.rep_;
      iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result);
      memset(pRVar15,0,(long)iVar6 << 3);
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this->unused_dependency_);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
    for (local_114 = 0; iVar6 = local_114,
        iVar7 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)result),
        iVar6 < iVar7; local_114 = local_114 + 1) {
      local_118 = FileDescriptorProto::weak_dependency((FileDescriptorProto *)result,local_114);
      pVar19 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,&local_118);
      _Stack_128 = pVar19.first._M_node;
      local_120 = pVar19.second;
    }
    for (local_12c = 0; kVar3 = local_12c,
        iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result), kVar3 < iVar6;
        local_12c = local_12c + 1) {
      psVar12 = FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)result,local_12c);
      pVar20 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&weak_deps._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar12);
      dependency = (FileDescriptor *)pVar20.first._M_node;
      local_148 = pVar20.second;
      local_140 = (_Base_ptr)dependency;
      local_138 = local_148;
      if (((local_148 ^ 0xff) & 1) != 0) {
        AddTwiceListedError(this,(FileDescriptorProto *)result,local_12c);
      }
      pTVar1 = this->tables_;
      psVar12 = FileDescriptorProto::dependency_abi_cxx11_((FileDescriptorProto *)result,local_12c);
      local_158 = (SourceCodeInfo *)DescriptorPool::Tables::FindFile(pTVar1,psVar12);
      if ((local_158 == (SourceCodeInfo *)0x0) && (this->pool_->underlay_ != (DescriptorPool *)0x0))
      {
        pDVar2 = this->pool_->underlay_;
        psVar12 = FileDescriptorProto::dependency_abi_cxx11_
                            ((FileDescriptorProto *)result,local_12c);
        local_158 = (SourceCodeInfo *)DescriptorPool::FindFileByName(pDVar2,psVar12);
      }
      if (local_158 == info) {
        DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
        this_local = (DescriptorBuilder *)0x0;
        goto LAB_004dfa8e;
      }
      if (local_158 == (SourceCodeInfo *)0x0) {
        local_331 = true;
        if ((this->pool_->allow_unknown_ & 1U) == 0) {
          local_332 = false;
          if ((this->pool_->enforce_weak_ & 1U) == 0) {
            local_168._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::find
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,&local_12c);
            local_170._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
            local_332 = std::operator!=(&local_168,&local_170);
          }
          local_331 = local_332;
        }
        if (local_331 == false) {
          if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
            AddImportError(this,(FileDescriptorProto *)result,local_12c);
          }
        }
        else {
          pDVar2 = this->pool_;
          psVar12 = FileDescriptorProto::dependency_abi_cxx11_
                              ((FileDescriptorProto *)result,local_12c);
          local_158 = (SourceCodeInfo *)
                      DescriptorPool::NewPlaceholderFileWithMutexHeld(pDVar2,psVar12);
        }
      }
      else {
        bVar4 = false;
        if ((this->pool_->enforce_dependencies_ & 1U) != 0) {
          pDVar2 = this->pool_;
          psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
          local_178._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&pDVar2->unused_import_track_files_,psVar12);
          local_180._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->pool_->unused_import_track_files_);
          bVar5 = std::operator!=(&local_178,&local_180);
          bVar4 = false;
          if (bVar5) {
            iVar6 = FileDescriptor::public_dependency_count((FileDescriptor *)local_158);
            bVar4 = iVar6 == 0;
          }
        }
        if (bVar4) {
          pVar21 = std::
                   set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ::insert(&this->unused_dependency_,(value_type *)&local_158);
          _i_2 = pVar21.first._M_node;
          local_188 = pVar21.second;
        }
      }
      *(SourceCodeInfo **)
       (*(long *)&(info->location_).super_RepeatedPtrFieldBase.current_size_ + (long)local_12c * 8)
           = local_158;
      if (((this->pool_->lazily_build_dependencies_ & 1U) != 0) &&
         (local_158 == (SourceCodeInfo *)0x0)) {
        pTVar1 = this->tables_;
        psVar12 = FileDescriptorProto::dependency_abi_cxx11_
                            ((FileDescriptorProto *)result,local_12c);
        psVar12 = DescriptorPool::Tables::AllocateString(pTVar1,psVar12);
        ((info->location_).super_RepeatedPtrFieldBase.rep_)->elements[(long)local_12c + -1] =
             psVar12;
      }
    }
    index = 0;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::public_dependency_size((FileDescriptorProto *)result);
    piVar16 = DescriptorPool::Tables::AllocateArray<int>(pTVar1,iVar6);
    *(int **)&info[1]._has_bits_ = piVar16;
    for (local_198 = 0; iVar6 = local_198,
        iVar7 = FileDescriptorProto::public_dependency_size((FileDescriptorProto *)result),
        iVar6 < iVar7; local_198 = local_198 + 1) {
      iVar8 = FileDescriptorProto::public_dependency((FileDescriptorProto *)result,local_198);
      local_19c = iVar8;
      if ((iVar8 < 0) ||
         (iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result),
         iVar6 <= iVar8)) {
        psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
        AddError(this,psVar12,(Message *)result,OTHER,"Invalid public dependency index.");
      }
      else {
        iVar6 = index + 1;
        *(int *)(*(long *)&info[1]._has_bits_ + (long)index * 4) = local_19c;
        index = iVar6;
        if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
          _weak_dependency_count = FileDescriptor::dependency((FileDescriptor *)info,local_19c);
          std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::erase(&this->unused_dependency_,(key_type *)&weak_dependency_count);
        }
      }
    }
    *(int *)&info[1]._internal_metadata_.
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ = index;
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this->dependencies_);
    if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
      for (i_4 = 0; iVar6 = FileDescriptor::dependency_count((FileDescriptor *)info), i_4 < iVar6;
          i_4 = i_4 + 1) {
        pFVar17 = FileDescriptor::dependency((FileDescriptor *)info,i_4);
        RecordPublicDependencies(this,pFVar17);
      }
    }
    index_1 = 0;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)result);
    piVar16 = DescriptorPool::Tables::AllocateArray<int>(pTVar1,iVar6);
    *(int **)&info[1].location_.super_RepeatedPtrFieldBase.current_size_ = piVar16;
    for (i_5 = 0; iVar6 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)result),
        i_5 < iVar6; i_5 = i_5 + 1) {
      iVar8 = FileDescriptorProto::weak_dependency((FileDescriptorProto *)result,i_5);
      if ((iVar8 < 0) ||
         (iVar6 = FileDescriptorProto::dependency_size((FileDescriptorProto *)result),
         iVar6 <= iVar8)) {
        psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
        AddError(this,psVar12,(Message *)result,OTHER,"Invalid weak dependency index.");
      }
      else {
        *(int32 *)(*(long *)&info[1].location_.super_RepeatedPtrFieldBase.current_size_ +
                  (long)index_1 * 4) = iVar8;
        index_1 = index_1 + 1;
      }
    }
    *(int *)&info[1].location_.super_RepeatedPtrFieldBase.arena_ = index_1;
    iVar6 = FileDescriptorProto::message_type_size((FileDescriptorProto *)result);
    *(int *)&info[1].location_.super_RepeatedPtrFieldBase.rep_ = iVar6;
    iVar6 = FileDescriptorProto::message_type_size((FileDescriptorProto *)result);
    AllocateArray<google::protobuf::Descriptor>(this,iVar6,(Descriptor **)(info + 2));
    for (i_7 = 0; iVar6 = FileDescriptorProto::message_type_size((FileDescriptorProto *)result),
        i_7 < iVar6; i_7 = i_7 + 1) {
      pDVar18 = FileDescriptorProto::message_type((FileDescriptorProto *)result,i_7);
      BuildMessage(this,pDVar18,(Descriptor *)0x0,
                   (Descriptor *)
                   (info[2].super_Message.super_MessageLite._vptr_MessageLite + (long)i_7 * 0x15));
    }
    iVar6 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)result);
    *(int *)&info[2]._internal_metadata_.
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ = iVar6;
    iVar6 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)result);
    AllocateArray<google::protobuf::EnumDescriptor>
              (this,iVar6,(EnumDescriptor **)&info[2]._has_bits_);
    for (i_8 = 0; iVar6 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)result),
        i_8 < iVar6; i_8 = i_8 + 1) {
      proto_00 = FileDescriptorProto::enum_type((FileDescriptorProto *)result,i_8);
      BuildEnum(this,proto_00,(Descriptor *)0x0,
                (EnumDescriptor *)(*(long *)&info[2]._has_bits_ + (long)i_8 * 0x38));
    }
    iVar6 = FileDescriptorProto::service_size((FileDescriptorProto *)result);
    *(int *)&info[2].location_.super_RepeatedPtrFieldBase.arena_ = iVar6;
    iVar6 = FileDescriptorProto::service_size((FileDescriptorProto *)result);
    AllocateArray<google::protobuf::ServiceDescriptor>
              (this,iVar6,
               (ServiceDescriptor **)&info[2].location_.super_RepeatedPtrFieldBase.current_size_);
    for (option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ = 0;
        iVar6 = FileDescriptorProto::service_size((FileDescriptorProto *)result),
        option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ < iVar6;
        option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ =
             option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ + 1) {
      proto_01 = FileDescriptorProto::service
                           ((FileDescriptorProto *)result,
                            option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_);
      BuildService(this,proto_01,(void *)0x0,
                   (ServiceDescriptor *)
                   (*(long *)&info[2].location_.super_RepeatedPtrFieldBase.current_size_ +
                   (long)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ *
                   0x30));
    }
    iVar6 = FileDescriptorProto::extension_size((FileDescriptorProto *)result);
    *(int *)&info[2].location_.super_RepeatedPtrFieldBase.rep_ = iVar6;
    iVar6 = FileDescriptorProto::extension_size((FileDescriptorProto *)result);
    AllocateArray<google::protobuf::FieldDescriptor>
              (this,iVar6,(FieldDescriptor **)&info[3]._internal_metadata_);
    for (option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._0_4_ = 0;
        iVar6 = FileDescriptorProto::extension_size((FileDescriptorProto *)result),
        (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal < iVar6;
        option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._0_4_ =
             (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal + 1) {
      proto_02 = FileDescriptorProto::extension
                           ((FileDescriptorProto *)result,
                            (int)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal);
      BuildExtension(this,proto_02,(Descriptor *)0x0,
                     (FieldDescriptor *)
                     ((long)info[3]._internal_metadata_.
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_ +
                     (long)(int)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal *
                     0xa8));
    }
    bVar4 = FileDescriptorProto::has_options((FileDescriptorProto *)result);
    if (bVar4) {
      orig_options = FileDescriptorProto::options((FileDescriptorProto *)result);
      AllocateOptions(this,orig_options,(FileDescriptor *)info);
    }
    else {
      info[3]._has_bits_ = (uint32  [1])0x0;
      info[3]._cached_size_ = 0;
    }
    CrossLinkFile(this,(FileDescriptor *)info,(FileDescriptorProto *)result);
    if ((this->had_errors_ & 1U) == 0) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&iter,this);
      local_210._M_current =
           (OptionsToInterpret *)
           std::
           vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ::begin(&this->options_to_interpret_);
      while( true ) {
        iStack_218 = std::
                     vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ::end(&this->options_to_interpret_);
        bVar4 = __gnu_cxx::operator!=(&local_210,&stack0xfffffffffffffde8);
        if (!bVar4) break;
        options_to_interpret =
             __gnu_cxx::
             __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
             ::operator*(&local_210);
        OptionInterpreter::InterpretOptions((OptionInterpreter *)&iter,options_to_interpret);
        __gnu_cxx::
        __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
        ::operator++(&local_210);
      }
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::clear(&this->options_to_interpret_);
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&iter);
    }
    if (((this->had_errors_ & 1U) == 0) && ((this->pool_->lazily_build_dependencies_ & 1U) == 0)) {
      ValidateFileOptions(this,(FileDescriptor *)info,(FileDescriptorProto *)result);
    }
    if ((this->had_errors_ & 1U) != 0) {
      for (local_21c = 0;
          iVar6 = FileDescriptorProto::message_type_size((FileDescriptorProto *)result),
          local_21c < iVar6; local_21c = local_21c + 1) {
        message = FileDescriptor::message_type((FileDescriptor *)info,local_21c);
        pDVar18 = FileDescriptorProto::message_type((FileDescriptorProto *)result,local_21c);
        DetectMapConflicts(this,message,pDVar18);
      }
    }
    bVar4 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::empty(&this->unused_dependency_);
    if ((!bVar4) && ((this->pool_->lazily_build_dependencies_ & 1U) == 0)) {
      LogUnusedDependency(this,(FileDescriptorProto *)result,(FileDescriptor *)info);
    }
    if ((this->had_errors_ & 1U) == 0) {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      *(undefined1 *)&info[3].location_.super_RepeatedPtrFieldBase.rep_ = 1;
      this_local = (DescriptorBuilder *)info;
    }
    else {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
      this_local = (DescriptorBuilder *)0x0;
    }
LAB_004dfa8e:
    local_15c = 1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&weak_deps._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    psVar12 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
    AddError(this,psVar12,(Message *)result,OTHER,"A file with this name is already in the pool.");
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    this_local = (DescriptorBuilder *)0x0;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const string*>(proto.dependency_size());
    memset(result->dependencies_names_, 0,
           sizeof(*result->dependencies_names_) * proto.dependency_size());
  } else {
    result->dependencies_once_ = NULL;
    result->dependencies_names_ = NULL;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      tables_->RollbackToLastCheckpoint();
      return NULL;
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_ ||
          (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
        dependency =
            pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
      } else {
        if (!pool_->lazily_build_dependencies_) {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    return result;
  }
}